

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O2

void SequenceTask::run(search *sch,multi_ex *ec)

{
  pointer ppeVar1;
  uint32_t count;
  action aVar2;
  predictor *ppVar3;
  stringstream *psVar4;
  ostream *poVar5;
  ulong uVar6;
  string sStack_138;
  predictor P;
  
  Search::predictor::predictor(&P,sch,0);
  for (uVar6 = 0;
      ppeVar1 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppeVar1 >> 3);
      uVar6 = uVar6 + 1) {
    aVar2 = (ppeVar1[uVar6]->l).multi.label;
    ppVar3 = Search::predictor::set_tag(&P,(ptag)uVar6 + 1);
    ppVar3 = Search::predictor::set_input
                       (ppVar3,(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar6]);
    ppVar3 = Search::predictor::set_oracle(ppVar3,aVar2);
    count = Search::search::get_history_length(sch);
    ppVar3 = Search::predictor::set_condition_range(ppVar3,(ptag)uVar6,count,'p');
    aVar2 = Search::predictor::predict(ppVar3);
    psVar4 = Search::search::output_abi_cxx11_(sch);
    if (*(int *)(psVar4 + *(long *)(*(long *)psVar4 + -0x18) + 0x20) == 0) {
      psVar4 = Search::search::output_abi_cxx11_(sch);
      Search::search::pretty_label_abi_cxx11_(&sStack_138,sch,aVar2);
      poVar5 = std::operator<<((ostream *)(psVar4 + 0x10),(string *)&sStack_138);
      std::operator<<(poVar5,' ');
      std::__cxx11::string::~string((string *)&sStack_138);
    }
  }
  Search::predictor::~predictor(&P);
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  Search::predictor P(sch, (ptag)0);
  for (size_t i = 0; i < ec.size(); i++)
  {
    action oracle = ec[i]->l.multi.label;
    size_t prediction = P.set_tag((ptag)i + 1)
                            .set_input(*ec[i])
                            .set_oracle(oracle)
                            .set_condition_range((ptag)i, sch.get_history_length(), 'p')
                            .predict();

    if (sch.output().good())
      sch.output() << sch.pretty_label((uint32_t)prediction) << ' ';
  }
}